

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O3

void idx2::Insert<unsigned_long,idx2::chunk_meta_info>
               (iterator *It,unsigned_long *Key,chunk_meta_info *Val)

{
  long lVar1;
  byte bVar2;
  chunk_meta_info *pcVar3;
  hash_table<unsigned_long,_idx2::chunk_meta_info> *this;
  long lVar4;
  byte *pbVar5;
  i64 iVar6;
  allocator *paVar7;
  i64 iVar8;
  i64 iVar9;
  allocator *paVar10;
  byte *pbVar11;
  i64 iVar12;
  byte *pbVar13;
  u64 uVar14;
  int iVar15;
  undefined4 uVar16;
  iterator local_30;
  
  *It->Key = *Key;
  pcVar3 = It->Val;
  pbVar5 = (Val->Addrs).Buffer.Data;
  iVar6 = (Val->Addrs).Buffer.Bytes;
  paVar7 = (Val->Addrs).Buffer.Alloc;
  iVar8 = (Val->Addrs).Size;
  iVar9 = (Val->Addrs).Capacity;
  paVar10 = (Val->Addrs).Alloc;
  pbVar11 = (Val->Sizes).Stream.Data;
  iVar12 = (Val->Sizes).Stream.Bytes;
  pbVar13 = (Val->Sizes).BitPtr;
  uVar14 = (Val->Sizes).BitBuf;
  iVar15 = (Val->Sizes).BitPos;
  uVar16 = *(undefined4 *)&(Val->Sizes).field_0x2c;
  (pcVar3->Sizes).Stream.Alloc = (Val->Sizes).Stream.Alloc;
  (pcVar3->Sizes).BitPtr = pbVar13;
  (pcVar3->Sizes).BitBuf = uVar14;
  (pcVar3->Sizes).BitPos = iVar15;
  *(undefined4 *)&(pcVar3->Sizes).field_0x2c = uVar16;
  (pcVar3->Addrs).Capacity = iVar9;
  (pcVar3->Addrs).Alloc = paVar10;
  (pcVar3->Sizes).Stream.Data = pbVar11;
  (pcVar3->Sizes).Stream.Bytes = iVar12;
  (pcVar3->Addrs).Buffer.Data = pbVar5;
  (pcVar3->Addrs).Buffer.Bytes = iVar6;
  (pcVar3->Addrs).Buffer.Alloc = paVar7;
  (pcVar3->Addrs).Size = iVar8;
  this = It->Ht;
  this->Stats[It->Idx] = Occupied;
  lVar4 = this->Size;
  lVar1 = lVar4 + 1;
  this->Size = lVar1;
  bVar2 = (byte)this->LogCapacity;
  if (7L << (bVar2 & 0x3f) <= (lVar4 * 2 + 2) * 5) {
    IncreaseCapacity<unsigned_long,idx2::chunk_meta_info>
              (&local_30,(idx2 *)this,(hash_table<unsigned_long,_idx2::chunk_meta_info> *)It,
               (iterator *)CONCAT71((int7)((ulong)lVar1 >> 8),bVar2));
    It->Key = local_30.Key;
    It->Val = local_30.Val;
    It->Ht = local_30.Ht;
    It->Idx = local_30.Idx;
  }
  return;
}

Assistant:

void
Insert(typename hash_table<k, v>::iterator* It, const k& Key, const v& Val)
{
  idx2_Assert((*It) != End(*(It->Ht)));
  *(It->Key) = Key;
  *(It->Val) = Val;
  It->Ht->Stats[It->Idx] = hash_table<k, v>::Occupied;
  ++It->Ht->Size;

  if (Size(*(It->Ht)) * 10 >= Capacity(*(It->Ht)) * 7)
  {
    *(It) = IncreaseCapacity(It->Ht, *It);
  }
}